

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collection.hpp
# Opt level: O1

int __thiscall diy::Collection::add(Collection *this,Element e)

{
  pointer *pppvVar1;
  iterator __position;
  iterator __position_00;
  Element local_30;
  CInt *local_28;
  unique_lock<std::recursive_mutex> local_20;
  
  __position._M_current =
       (this->elements_).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_30 = e;
  if (__position._M_current ==
      (this->elements_).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<void*,std::allocator<void*>>::_M_realloc_insert<void*const&>
              ((vector<void*,std::allocator<void*>> *)&this->elements_,__position,&local_30);
  }
  else {
    *__position._M_current = e;
    pppvVar1 = &(this->elements_).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppvVar1 = *pppvVar1 + 1;
  }
  local_28 = (CInt *)CONCAT44(local_28._4_4_,0xffffffff);
  __position_00._M_current =
       (this->external_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position_00._M_current ==
      (this->external_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&this->external_,__position_00,(int *)&local_28);
  }
  else {
    *__position_00._M_current = -1;
    (this->external_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = __position_00._M_current + 1;
  }
  local_28 = &this->in_memory_;
  local_20._M_device = &(this->in_memory_).m_;
  local_20._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_20);
  local_20._M_owns = true;
  local_28->x_ = local_28->x_ + 1;
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_20);
  return (int)((ulong)((long)(this->elements_).super__Vector_base<void_*,_std::allocator<void_*>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->elements_).super__Vector_base<void_*,_std::allocator<void_*>_>.
                            _M_impl.super__Vector_impl_data._M_start) >> 3) + -1;
}

Assistant:

int           add(Element e)                  { elements_.push_back(e); external_.push_back(-1); ++(*in_memory_.access()); return static_cast<int>(elements_.size()) - 1; }